

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateMaxBroadcastableLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,2,2);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
    Result::good(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateMaxBroadcastableLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
        if (!r.good()) {
            return r;
        }
    }
    return r;
}